

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBlob.h
# Opt level: O2

STBlob * __thiscall jbcoin::STBlob::operator=(STBlob *this,Slice *slice)

{
  Buffer local_20;
  
  Buffer::Buffer(&local_20,slice->data_,slice->size_);
  Buffer::operator=(&this->value_,&local_20);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_20.p_)
  ;
  return this;
}

Assistant:

STBlob&
    operator= (Slice const& slice)
    {
        value_ = Buffer(slice.data(), slice.size());
        return *this;
    }